

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O1

bool ensure_file_is_writable(char *pFilename)

{
  FILE *__stream;
  uint uVar1;
  bool bVar2;
  
  uVar1 = 0;
  bVar2 = true;
  do {
    __stream = fopen64(pFilename,"wb");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      return bVar2;
    }
    usleep(250000);
    bVar2 = uVar1 < 7;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 8);
  return bVar2;
}

Assistant:

static bool ensure_file_is_writable(const char *pFilename)
{
   const int cNumRetries = 8;
   for (int i = 0; i < cNumRetries; i++)
   {
      FILE *pFile = fopen(pFilename, "wb");
      if (pFile)
      {
         fclose(pFile);
         return true;
      }
      Sleep(250);
   }
   return false;
}